

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O2

int mbedtls_asn1_write_tagged_string(uchar **p,uchar *start,int tag,char *text,size_t text_len)

{
  uchar *puVar1;
  int iVar2;
  
  puVar1 = *p;
  if ((ulong)((long)puVar1 - (long)start) < text_len || puVar1 < start) {
    text_len = 0xffffffffffffff94;
  }
  else {
    *p = puVar1 + -text_len;
    memcpy(puVar1 + -text_len,text,text_len);
    if (-1 < (int)(uint)text_len) {
      iVar2 = mbedtls_asn1_write_len_and_tag
                        (p,start,(ulong)((uint)text_len & 0x7fffffff),(uchar)tag);
      return iVar2;
    }
  }
  return (int)text_len;
}

Assistant:

int mbedtls_asn1_write_tagged_string(unsigned char **p, const unsigned char *start, int tag,
                                     const char *text, size_t text_len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len = 0;

    MBEDTLS_ASN1_CHK_ADD(len, mbedtls_asn1_write_raw_buffer(p, start,
                                                            (const unsigned char *) text,
                                                            text_len));

    return mbedtls_asn1_write_len_and_tag(p, start, len, tag);
}